

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_impl<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  detail tag_00;
  runtime_error *this;
  string_view tag_01;
  string_view full_tag_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  full_tag_local._len = full_tag._len;
  full_tag_local._ptr = full_tag._ptr;
  if (max_recursion == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    string_view::to_string_abi_cxx11_(&local_58,&full_tag_local);
    std::operator+(&local_38,"Recursion limit exceeded while visiting tag: ",&local_58);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((char *)tag._len != (char *)0x0) {
    tag_00 = *(detail *)tag._ptr;
    if (tag_00 == (detail)0x28) {
      visit_tuple<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
    }
    else {
      if (tag_00 == (detail)0x2f) {
        tag_01._len = (size_t)visitor;
        tag_01._ptr = (char *)tag._len;
        visit_enum<Visitor,std::ifstream>
                  ((detail *)tag._ptr,tag_01,(Visitor *)istream,
                   (basic_ifstream<char,_std::char_traits<char>_> *)visitor);
        return;
      }
      if (tag_00 == (detail)0x3c) {
        visit_variant<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
      }
      else if (tag_00 == (detail)0x7b) {
        visit_struct<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
      }
      else {
        if (tag_00 != (detail)0x5b) {
          visit_arithmetic<Visitor,std::ifstream>((char)tag_00,visitor,istream);
          return;
        }
        visit_sequence<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
      }
    }
  }
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}